

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O0

var __thiscall cs::runtime_type::parse_typeid(runtime_type *this,var *b)

{
  bool bVar1;
  structure *this_00;
  type_id *in_RDX;
  type_info *in_RSI;
  proxy *in_RDI;
  any *in_stack_00000060;
  proxy *args;
  
  args = in_RDI;
  cs_impl::any::type((any *)in_RDI);
  bVar1 = std::type_info::operator==(in_RSI,(type_info *)in_RDX);
  if (bVar1) {
    cs_impl::any::const_val<cs::type_t>(in_stack_00000060);
    cs_impl::any::any<cs::type_id>((any *)in_RSI,in_RDX);
  }
  else {
    cs_impl::any::type((any *)in_RDI);
    bVar1 = std::type_info::operator==(in_RSI,(type_info *)in_RDX);
    if (bVar1) {
      this_00 = cs_impl::any::const_val<cs::structure>(in_stack_00000060);
      structure::get_id(this_00);
      cs_impl::any::any<cs::type_id>((any *)in_RSI,in_RDX);
    }
    else {
      cs_impl::any::type((any *)in_RDI);
      cs_impl::any::make<cs::type_id,std::type_info_const&>((type_info *)args);
    }
  }
  return (var)in_RDI;
}

Assistant:

var runtime_type::parse_typeid(const var &b)
	{
		if (b.type() == typeid(type_t))
			return b.const_val<type_t>().id;
		else if (b.type() == typeid(structure))
			return b.const_val<structure>().get_id();
		else
			return var::make<type_id>(b.type());
	}